

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O2

void __thiscall
cfd::core::Psbt::SetTxInUtxo
          (Psbt *this,uint32_t index,Transaction *tx,Script *redeem_script,
          vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *key_list)

{
  Script *object;
  uint index_00;
  void *pvVar1;
  Script *object_00;
  vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *key_list_00;
  bool is_witness;
  int iVar2;
  uint32_t uVar3;
  CfdException *pCVar4;
  undefined4 in_register_00000034;
  long lVar5;
  long lVar6;
  allocator local_14d;
  int ret;
  wally_tx *wally_tx_obj;
  Script local_140;
  ulong local_108;
  Script *local_100;
  vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *local_f8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> tx_txid;
  TxOutReference txout;
  Txid txid;
  Script new_redeem_script;
  
  local_100 = redeem_script;
  local_f8 = key_list;
  (*this->_vptr_Psbt[2])(this,CONCAT44(in_register_00000034,index),0x8b9,"SetTxInUtxo");
  pvVar1 = this->wally_psbt_pointer_;
  lVar5 = *(long *)(*(long *)((long)pvVar1 + 8) + 8);
  local_108 = (ulong)index;
  lVar6 = local_108 * 0xd0;
  index_00 = *(uint *)(lVar5 + 0x20 + lVar6);
  AbstractTransaction::GetTxid(&txid,&tx->super_AbstractTransaction);
  Txid::GetData((ByteData *)&txout,&txid);
  ByteData::GetBytes(&tx_txid,(ByteData *)&txout);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&txout);
  iVar2 = bcmp((void *)(lVar5 + lVar6),
               tx_txid.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start,
               (long)tx_txid.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)tx_txid.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start);
  key_list_00 = local_f8;
  object_00 = local_100;
  if (iVar2 == 0) {
    uVar3 = Transaction::GetTxOutCount(tx);
    if (index_00 < uVar3) {
      Transaction::GetTxOut(&txout,tx,index_00);
      Script::Script(&new_redeem_script,object_00);
      object = &txout.super_AbstractTxOutReference.locking_script_;
      Script::Script(&local_140,object);
      is_witness = ValidatePsbtUtxo(&txid,index_00,&local_140,object_00,key_list_00,
                                    &new_redeem_script);
      Script::~Script(&local_140);
      wally_tx_obj = (wally_tx *)0x0;
      AbstractTransaction::GetHex_abi_cxx11_((string *)&local_140,&tx->super_AbstractTransaction);
      iVar2 = wally_tx_from_hex(local_140._vptr_Script,0,&wally_tx_obj);
      ::std::__cxx11::string::~string((string *)&local_140);
      ret = iVar2;
      if (iVar2 != 0) {
        local_140._vptr_Script = (_func_int **)0x22e1c0;
        local_140.script_data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start._0_4_ = 0x8cf;
        local_140.script_data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = "SetTxInUtxo";
        logger::warn<int&>((CfdSourceLocation *)&local_140,"wally_tx_from_hex NG[{}]",&ret);
        pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
        ::std::__cxx11::string::string((string *)&local_140,"psbt tx from hex error.",&local_14d);
        CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)&local_140);
        __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
      }
      if ((wally_tx_obj->num_inputs != 0) && (wally_tx_obj->num_outputs != 0)) {
        lVar5 = local_108 * 0x110;
        ret = wally_psbt_input_set_utxo(*(long *)((long)pvVar1 + 0x10) + lVar5);
        if (ret != 0) {
          wally_tx_free(wally_tx_obj);
          local_140._vptr_Script = (_func_int **)0x22e1c0;
          local_140.script_data_.data_.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start._0_4_ = 0x8db;
          local_140.script_data_.data_.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish = "SetTxInUtxo";
          logger::warn<int&>((CfdSourceLocation *)&local_140,"wally_psbt_input_set_utxo NG[{}]",&ret
                            );
          pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
          ::std::__cxx11::string::string((string *)&local_140,"psbt add utxo error.",&local_14d);
          CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)&local_140);
          __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
        }
        iVar2 = 0;
        if (is_witness) {
          ret = wally_psbt_input_set_witness_utxo
                          (*(long *)((long)pvVar1 + 0x10) + lVar5,wally_tx_obj->outputs + index_00);
          iVar2 = ret;
          if (ret != 0) {
            wally_tx_free(wally_tx_obj);
            local_140._vptr_Script = (_func_int **)0x22e1c0;
            local_140.script_data_.data_.
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start._0_4_ = 0x8e3;
            local_140.script_data_.data_.
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish = "SetTxInUtxo";
            logger::warn<int&>((CfdSourceLocation *)&local_140,
                               "wally_psbt_input_set_witness_utxo NG[{}]",&ret);
            pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
            ::std::__cxx11::string::string
                      ((string *)&local_140,"psbt add witness utxo error.",&local_14d);
            CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)&local_140);
            __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
          }
        }
        ret = iVar2;
        wally_tx_free(wally_tx_obj);
        lVar6 = *(long *)((long)pvVar1 + 0x10);
        Script::Script(&local_140,object);
        SetPsbtTxInScriptAndKeyList
                  ((wally_psbt_input *)(lVar6 + lVar5),is_witness,&new_redeem_script,key_list_00,
                   &local_140);
        Script::~Script(&local_140);
        Script::~Script(&new_redeem_script);
        AbstractTxOutReference::~AbstractTxOutReference(&txout.super_AbstractTxOutReference);
        ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  (&tx_txid.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
        Txid::~Txid(&txid);
        return;
      }
      wally_tx_free(wally_tx_obj);
      local_140._vptr_Script = (_func_int **)0x22e1c0;
      local_140.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
      ._M_impl.super__Vector_impl_data._M_start._0_4_ = 0x8d4;
      local_140.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
      ._M_impl.super__Vector_impl_data._M_finish = "SetTxInUtxo";
      logger::warn<>((CfdSourceLocation *)&local_140,"invalind utxo transaction format.");
      pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::__cxx11::string::string((string *)&local_140,"psbt invalid tx error.",&local_14d);
      CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)&local_140);
      __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
    }
  }
  txout.super_AbstractTxOutReference._vptr_AbstractTxOutReference = (_func_int **)0x22e1c0;
  txout.super_AbstractTxOutReference.value_.amount_._0_4_ = 0x8c2;
  txout.super_AbstractTxOutReference.value_._8_8_ = anon_var_dwarf_17e264;
  logger::warn<>((CfdSourceLocation *)&txout,"unmatch outpoint.");
  pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::__cxx11::string::string
            ((string *)&txout,"unmatch outpoint.",(allocator *)&new_redeem_script);
  CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)&txout);
  __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

void Psbt::SetTxInUtxo(
    uint32_t index, const Transaction &tx, const Script &redeem_script,
    const std::vector<KeyData> &key_list) {
  CheckTxInIndex(index, __LINE__, __FUNCTION__);
  struct wally_psbt *psbt_pointer;
  psbt_pointer = static_cast<struct wally_psbt *>(wally_psbt_pointer_);
  uint8_t *txhash = psbt_pointer->tx->inputs[index].txhash;
  uint32_t vout = psbt_pointer->tx->inputs[index].index;
  auto txid = tx.GetTxid();
  auto tx_txid = txid.GetData().GetBytes();
  if ((memcmp(txhash, tx_txid.data(), tx_txid.size()) != 0) ||
      (vout >= tx.GetTxOutCount())) {
    warn(CFD_LOG_SOURCE, "unmatch outpoint.");
    throw CfdException(kCfdIllegalArgumentError, "unmatch outpoint.");
  }

  auto txout = tx.GetTxOut(vout);
  Script new_redeem_script = redeem_script;
  bool is_witness = ValidatePsbtUtxo(
      txid, vout, txout.GetLockingScript(), redeem_script, key_list,
      &new_redeem_script);

  struct wally_tx *wally_tx_obj = nullptr;
  int ret = wally_tx_from_hex(tx.GetHex().c_str(), 0, &wally_tx_obj);
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_tx_from_hex NG[{}]", ret);
    throw CfdException(kCfdIllegalArgumentError, "psbt tx from hex error.");
  } else if (
      (wally_tx_obj->num_inputs == 0) || (wally_tx_obj->num_outputs == 0)) {
    wally_tx_free(wally_tx_obj);
    warn(CFD_LOG_SOURCE, "invalind utxo transaction format.");
    throw CfdException(kCfdIllegalArgumentError, "psbt invalid tx error.");
  }

  ret = wally_psbt_input_set_utxo(&psbt_pointer->inputs[index], wally_tx_obj);
  if (ret != WALLY_OK) {
    wally_tx_free(wally_tx_obj);
    warn(CFD_LOG_SOURCE, "wally_psbt_input_set_utxo NG[{}]", ret);
    throw CfdException(kCfdIllegalArgumentError, "psbt add utxo error.");
  }
  if (is_witness) {
    ret = wally_psbt_input_set_witness_utxo(
        &psbt_pointer->inputs[index], &wally_tx_obj->outputs[vout]);
    if (ret != WALLY_OK) {
      wally_tx_free(wally_tx_obj);
      warn(CFD_LOG_SOURCE, "wally_psbt_input_set_witness_utxo NG[{}]", ret);
      throw CfdException(
          kCfdIllegalArgumentError, "psbt add witness utxo error.");
    }
  }
  wally_tx_free(wally_tx_obj);

  SetPsbtTxInScriptAndKeyList(
      &psbt_pointer->inputs[index], is_witness, new_redeem_script, key_list,
      txout.GetLockingScript());
}